

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::AddFuncInfoToFinalizationSet(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  RealCount *pRVar1;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Type pSVar3;
  ArenaAllocator *alloc;
  
  pSVar2 = this->funcInfosToFinalize;
  if (pSVar2 == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    pSVar2 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
             new<Memory::ArenaAllocator>(0x18,this->alloc,0x364470);
    alloc = this->alloc;
    (pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pSVar2;
    (pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount.count =
         0;
    pSVar2->allocator = alloc;
    this->funcInfosToFinalize = pSVar2;
  }
  else {
    alloc = pSVar2->allocator;
  }
  pSVar3 = (Type)new<Memory::ArenaAllocator>(0x10,alloc,0x364470);
  pSVar3[1].next = (Type)funcInfo;
  pSVar3->next = (pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar3;
  pRVar1 = &(pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount
  ;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void ByteCodeGenerator::AddFuncInfoToFinalizationSet(FuncInfo * funcInfo)
{
    if (this->funcInfosToFinalize == nullptr)
    {
        this->funcInfosToFinalize = Anew(alloc, SList<FuncInfo*>, alloc);
    }

    this->funcInfosToFinalize->Prepend(funcInfo);
}